

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

lua_Integer luaL_checkinteger(lua_State *L,int arg)

{
  int iVar1;
  undefined8 in_RAX;
  lua_Integer lVar2;
  char *tname;
  int isnum;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  lVar2 = lua_tointegerx(L,arg,&local_24);
  if (local_24 == 0) {
    iVar1 = lua_isnumber(L,arg);
    if (iVar1 == 0) {
      tname = lua_typename(L,3);
      luaL_typeerror(L,arg,tname);
    }
    else {
      luaL_argerror(L,arg,"number has no integer representation");
    }
  }
  return lVar2;
}

Assistant:

LUALIB_API lua_Integer luaL_checkinteger (lua_State *L, int arg) {
  int isnum;
  lua_Integer d = lua_tointegerx(L, arg, &isnum);
  if (!isnum) {
    interror(L, arg);
  }
  return d;
}